

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lmathlib.c
# Opt level: O2

unsigned_long nextrand(unsigned_long *state)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar1 = state[1];
  uVar2 = state[2] ^ *state;
  uVar3 = state[3] ^ uVar1;
  *state = *state ^ uVar3;
  state[1] = uVar2 ^ uVar1;
  state[2] = uVar1 << 0x11 ^ uVar2;
  state[3] = uVar3 << 0x2d | uVar3 >> 0x13;
  return (uVar1 * 0x280 | uVar1 * 5 >> 0x39) * 9;
}

Assistant:

static Rand64 nextrand (Rand64 *state) {
  Rand64 state0 = state[0];
  Rand64 state1 = state[1];
  Rand64 state2 = state[2] ^ state0;
  Rand64 state3 = state[3] ^ state1;
  Rand64 res = rotl(state1 * 5, 7) * 9;
  state[0] = state0 ^ state3;
  state[1] = state1 ^ state2;
  state[2] = state2 ^ (state1 << 17);
  state[3] = rotl(state3, 45);
  return res;
}